

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ProgramUniformTests::init(ProgramUniformTests *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  DataType DVar2;
  AssignMethod assignMethod;
  _func_int **pp_Var3;
  Context *pCVar4;
  pointer pcVar5;
  long lVar6;
  pointer pUVar7;
  SharedPtrStateBase *pSVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  DataType DVar13;
  int iVar14;
  long lVar15;
  DataType *pDVar16;
  char *pcVar17;
  UniformCollection *pUVar18;
  long *plVar19;
  UniformCollection *pUVar20;
  TestNode *pTVar21;
  TestNode *pTVar22;
  UniformAssignCase *pUVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  size_type *psVar25;
  long *plVar26;
  char *pcVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  pointer pUVar31;
  UniformCollectionGroup *pUVar32;
  TestNode *pTVar33;
  int shaderType;
  uint uVar34;
  deUint32 in_stack_fffffffffffffb08;
  ulong local_4f0;
  string nameWithBoolType;
  string name;
  SharedPtrStateBase *local_498;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection> *local_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  TestNode *local_468;
  long *local_460 [2];
  long local_450 [2];
  ulong local_440;
  ulong local_438;
  TestNode *local_430;
  ulong local_428;
  string *local_420;
  string *local_418;
  TestNode *local_410;
  uint local_404;
  string nameWithMatrixType;
  string name_1;
  ostringstream s;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  UniformCollection *local_390;
  SharedPtrStateBase *local_388;
  ios_base local_340 [264];
  long local_238;
  ulong local_230;
  UniformCollectionGroup defaultUniformCollections [9];
  
  lVar15 = 0x1f8;
  paVar24 = &defaultUniformCollections[0].name.field_2;
  do {
    (((string *)(paVar24 + -1))->_M_dataplus)._M_p = (pointer)paVar24;
    *(size_type *)((long)paVar24 + -8) = 0;
    paVar24->_M_local_buf[0] = '\0';
    paVar24[1]._M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar24 + 0x18) = 0;
    paVar24[2]._M_allocated_capacity = 0;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)paVar24 + 0x38);
    lVar15 = lVar15 + -0x38;
  } while (lVar15 != 0);
  local_468 = (TestNode *)this;
  std::__cxx11::string::_M_replace
            ((ulong)defaultUniformCollections,0,
             (char *)defaultUniformCollections[0].name._M_string_length,0x99dc4c);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 1),0,
             (char *)defaultUniformCollections[1].name._M_string_length,0x985a0e);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 2),0,
             (char *)defaultUniformCollections[2].name._M_string_length,0x99dc16);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 3),0,
             (char *)defaultUniformCollections[3].name._M_string_length,0x99dc23);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 4),0,
             (char *)defaultUniformCollections[4].name._M_string_length,0x99dc33);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 5),0,
             (char *)defaultUniformCollections[5].name._M_string_length,0x99dc70);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 6),0,
             (char *)defaultUniformCollections[6].name._M_string_length,0x99dc43);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 7),0,
             (char *)defaultUniformCollections[7].name._M_string_length,0x99dc52);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 8),0,
             (char *)defaultUniformCollections[8].name._M_string_length,0x99dc67);
  pDVar16 = &s_testDataTypes;
  local_4f0 = 0;
  do {
    DVar2 = *pDVar16;
    pcVar17 = glu::getDataTypeName(DVar2);
    pUVar18 = anon_unknown_1::UniformCollection::basic
                        (DVar2,SSBOArrayLengthTests::init::arraysSized + 1);
    anon_unknown_1::UniformCollectionCase::UniformCollectionCase
              ((UniformCollectionCase *)&s,pcVar17,pUVar18);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
    ::push_back(&defaultUniformCollections[0].cases,(UniformCollectionCase *)&s);
    if (local_388 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &local_388->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_390 = (UniformCollection *)0x0;
        (*local_388->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &local_388->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_388 != (SharedPtrStateBase *)0x0) {
          (*local_388->_vptr_SharedPtrStateBase[1])();
        }
        local_388 = (SharedPtrStateBase *)0x0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != &local_3a0) {
      operator_delete(_s,local_3a0._M_allocated_capacity + 1);
    }
    uVar28 = (ulong)DVar2;
    if (DVar2 < TYPE_BOOL_VEC2) {
      if ((0x77003801cU >> (uVar28 & 0x3f) & 1) != 0) goto LAB_005204d3;
      if ((0x888004002U >> (uVar28 & 0x3f) & 1) == 0) goto LAB_00520b4a;
LAB_00520507:
      pUVar18 = anon_unknown_1::UniformCollection::basicArray
                          (DVar2,SSBOArrayLengthTests::init::arraysSized + 1);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,pcVar17,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[1].cases,(UniformCollectionCase *)&s);
      if (local_388 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_388->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_390 = (UniformCollection *)0x0;
          (*local_388->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_388->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_388 != (SharedPtrStateBase *)0x0) {
            (*local_388->_vptr_SharedPtrStateBase[1])();
          }
          local_388 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != &local_3a0) {
        operator_delete(_s,local_3a0._M_allocated_capacity + 1);
      }
    }
    else {
LAB_00520b4a:
      if (DVar2 - TYPE_BOOL_VEC2 < 3) {
LAB_005204d3:
        iVar12 = glu::getDataTypeScalarSize(DVar2);
        if (((iVar12 == 4) || ((int)local_4f0 == 0xc)) || ((int)local_4f0 == 0x19))
        goto LAB_00520507;
      }
      else if (((int)local_4f0 == 0x19) || ((int)local_4f0 == 0xc)) goto LAB_00520507;
    }
    if ((((local_4f0 & 0x3ffffffffffffffe) < 0x16) &&
        ((0x888004002U >> ((byte)DVar2 & 0x3f) & 1) != 0)) ||
       (((int)local_4f0 == 0x19 || ((int)local_4f0 == 0xc)))) {
      if ((DVar2 < TYPE_BOOL_VEC2) && ((0x888004002U >> (uVar28 & 0x3f) & 1) != 0)) {
        DVar13 = glu::getDataTypeVector(DVar2,4);
      }
      else {
        DVar13 = TYPE_LAST;
        if (local_4f0 == 0x19) {
          DVar13 = TYPE_SAMPLER_CUBE;
        }
        if (local_4f0 == 0xc) {
          DVar13 = TYPE_FLOAT_MAT2;
        }
      }
      glu::getDataTypeName(DVar13);
      local_488 = &local_478;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,0x98644f);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_488);
      nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
      psVar25 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar25) {
        nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
        nameWithBoolType.field_2._8_8_ = plVar19[3];
      }
      else {
        nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
        nameWithBoolType._M_dataplus._M_p = (pointer)*plVar19;
      }
      nameWithBoolType._M_string_length = plVar19[1];
      *plVar19 = (long)psVar25;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append((char *)&nameWithBoolType);
      _s = (pointer)&local_3a0;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 == paVar24) {
        local_3a0._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_3a0._8_8_ = plVar19[3];
      }
      else {
        local_3a0._M_allocated_capacity = paVar24->_M_allocated_capacity;
        _s = (pointer)*plVar19;
      }
      local_3a8 = plVar19[1];
      *plVar19 = (long)paVar24;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append((char *)&s);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar25 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar25) {
        name.field_2._M_allocated_capacity = *psVar25;
        name.field_2._8_8_ = plVar19[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar25;
        name._M_dataplus._M_p = (pointer)*plVar19;
      }
      name._M_string_length = plVar19[1];
      *plVar19 = (long)psVar25;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != &local_3a0) {
        operator_delete(_s,local_3a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
        operator_delete(nameWithBoolType._M_dataplus._M_p,
                        nameWithBoolType.field_2._M_allocated_capacity + 1);
      }
      if (local_488 != &local_478) {
        operator_delete(local_488,local_478 + 1);
      }
      _Var9._M_p = name._M_dataplus._M_p;
      pUVar18 = anon_unknown_1::UniformCollection::basicStruct(DVar2,DVar13,false,(char *)psVar25);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var9._M_p,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[2].cases,(UniformCollectionCase *)&s);
      if (local_388 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_388->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_390 = (UniformCollection *)0x0;
          (*local_388->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_388->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_388 != (SharedPtrStateBase *)0x0) {
            (*local_388->_vptr_SharedPtrStateBase[1])();
          }
          local_388 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != &local_3a0) {
        operator_delete(_s,local_3a0._M_allocated_capacity + 1);
      }
      _Var9._M_p = name._M_dataplus._M_p;
      pUVar18 = anon_unknown_1::UniformCollection::basicStruct(DVar2,DVar13,true,(char *)psVar25);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var9._M_p,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[4].cases,(UniformCollectionCase *)&s);
      if (local_388 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_388->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_390 = (UniformCollection *)0x0;
          (*local_388->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_388->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_388 != (SharedPtrStateBase *)0x0) {
            (*local_388->_vptr_SharedPtrStateBase[1])();
          }
          local_388 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != &local_3a0) {
        operator_delete(_s,local_3a0._M_allocated_capacity + 1);
      }
      _Var9._M_p = name._M_dataplus._M_p;
      pUVar18 = anon_unknown_1::UniformCollection::basicStruct(DVar2,DVar13,false,(char *)psVar25);
      glu::VarType::VarType
                ((VarType *)&nameWithBoolType,
                 &((pUVar18->m_uniforms).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type,3);
      glu::VarType::operator=
                (&((pUVar18->m_uniforms).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type,(VarType *)&nameWithBoolType);
      glu::VarType::~VarType((VarType *)&nameWithBoolType);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var9._M_p,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[3].cases,(value_type *)&s);
      if (local_388 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_388->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_390 = (UniformCollection *)0x0;
          (*local_388->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_388->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_388 != (SharedPtrStateBase *)0x0) {
            (*local_388->_vptr_SharedPtrStateBase[1])();
          }
          local_388 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != &local_3a0) {
        operator_delete(_s,local_3a0._M_allocated_capacity + 1);
      }
      _Var9._M_p = name._M_dataplus._M_p;
      pUVar18 = anon_unknown_1::UniformCollection::nestedArraysStructs
                          (DVar2,DVar13,SSBOArrayLengthTests::init::arraysSized + 1);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var9._M_p,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[5].cases,(UniformCollectionCase *)&s);
      if (local_388 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_388->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_390 = (UniformCollection *)0x0;
          (*local_388->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_388->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_388 != (SharedPtrStateBase *)0x0) {
            (*local_388->_vptr_SharedPtrStateBase[1])();
          }
          local_388 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != &local_3a0) {
        operator_delete(_s,local_3a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
    }
    local_4f0 = local_4f0 + 1;
    pDVar16 = pDVar16 + 1;
    if (local_4f0 == 0x1b) {
      pUVar18 = (UniformCollection *)operator_new(0x30);
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pDVar16 = &(anonymous_namespace)::UniformCollection::multipleBasic(char_const*)::types;
      lVar15 = 0;
      do {
        DVar2 = *pDVar16;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((ostringstream *)&s,(int)lVar15);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base(local_340);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_460,0,(char *)0x0,0x97b2af);
        local_488 = &local_478;
        plVar26 = plVar19 + 2;
        if ((long *)*plVar19 == plVar26) {
          local_478 = *plVar26;
          lStack_470 = plVar19[3];
        }
        else {
          local_478 = *plVar26;
          local_488 = (long *)*plVar19;
        }
        local_480 = plVar19[1];
        *plVar19 = (long)plVar26;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_488);
        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
        psVar25 = (size_type *)(plVar19 + 2);
        if ((size_type *)*plVar19 == psVar25) {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
          nameWithBoolType.field_2._8_8_ = plVar19[3];
        }
        else {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar19;
        }
        nameWithBoolType._M_string_length = plVar19[1];
        *plVar19 = (long)psVar25;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pUVar20 = anon_unknown_1::UniformCollection::basic(DVar2,nameWithBoolType._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
          operator_delete(nameWithBoolType._M_dataplus._M_p,
                          nameWithBoolType.field_2._M_allocated_capacity + 1);
        }
        if (local_488 != &local_478) {
          operator_delete(local_488,local_478 + 1);
        }
        if (local_460[0] != local_450) {
          operator_delete(local_460[0],local_450[0] + 1);
        }
        anon_unknown_1::UniformCollection::moveContents(pUVar20,pUVar18);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar20);
        operator_delete(pUVar20,0x30);
        lVar15 = lVar15 + 1;
        pDVar16 = pDVar16 + 1;
      } while (lVar15 != 5);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&name,(char *)0x0,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[6].cases,(value_type *)&name);
      if (local_498 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_498->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (*local_498->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_498->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_498 != (SharedPtrStateBase *)0x0) {
            (*local_498->_vptr_SharedPtrStateBase[1])();
          }
          local_498 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      pUVar18 = (UniformCollection *)operator_new(0x30);
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pDVar16 = &(anonymous_namespace)::UniformCollection::multipleBasicArray(char_const*)::types;
      lVar15 = 0;
      do {
        DVar2 = *pDVar16;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((ostringstream *)&s,(int)lVar15);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base(local_340);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_460,0,(char *)0x0,0x97b2af);
        local_488 = &local_478;
        plVar26 = plVar19 + 2;
        if ((long *)*plVar19 == plVar26) {
          local_478 = *plVar26;
          lStack_470 = plVar19[3];
        }
        else {
          local_478 = *plVar26;
          local_488 = (long *)*plVar19;
        }
        local_480 = plVar19[1];
        *plVar19 = (long)plVar26;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_488);
        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
        psVar25 = (size_type *)(plVar19 + 2);
        if ((size_type *)*plVar19 == psVar25) {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
          nameWithBoolType.field_2._8_8_ = plVar19[3];
        }
        else {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar19;
        }
        nameWithBoolType._M_string_length = plVar19[1];
        *plVar19 = (long)psVar25;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pUVar20 = anon_unknown_1::UniformCollection::basicArray
                            (DVar2,nameWithBoolType._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
          operator_delete(nameWithBoolType._M_dataplus._M_p,
                          nameWithBoolType.field_2._M_allocated_capacity + 1);
        }
        if (local_488 != &local_478) {
          operator_delete(local_488,local_478 + 1);
        }
        if (local_460[0] != local_450) {
          operator_delete(local_460[0],local_450[0] + 1);
        }
        anon_unknown_1::UniformCollection::moveContents(pUVar20,pUVar18);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar20);
        operator_delete(pUVar20,0x30);
        lVar15 = lVar15 + 1;
        pDVar16 = pDVar16 + 1;
      } while (lVar15 != 3);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&name,(char *)0x0,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[7].cases,(value_type *)&name);
      if (local_498 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_498->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (*local_498->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_498->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_498 != (SharedPtrStateBase *)0x0) {
            (*local_498->_vptr_SharedPtrStateBase[1])();
          }
          local_498 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      pUVar18 = (UniformCollection *)operator_new(0x30);
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar18->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar18->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar12 = 0;
      lVar15 = 0;
      do {
        DVar2 = *(DataType *)
                 ((long)&(anonymous_namespace)::UniformCollection::
                         multipleNestedArraysStructs(char_const*)::types0 + lVar15);
        DVar13 = *(DataType *)
                  ((long)&(anonymous_namespace)::UniformCollection::
                          multipleNestedArraysStructs(char_const*)::types1 + lVar15);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<(&s,iVar12);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base(local_340);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_460,0,(char *)0x0,0x97b2af);
        local_488 = &local_478;
        plVar26 = plVar19 + 2;
        if ((long *)*plVar19 == plVar26) {
          local_478 = *plVar26;
          lStack_470 = plVar19[3];
        }
        else {
          local_478 = *plVar26;
          local_488 = (long *)*plVar19;
        }
        local_480 = plVar19[1];
        *plVar19 = (long)plVar26;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_488);
        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
        psVar25 = (size_type *)(plVar19 + 2);
        if ((size_type *)*plVar19 == psVar25) {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
          nameWithBoolType.field_2._8_8_ = plVar19[3];
        }
        else {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar19;
        }
        nameWithBoolType._M_string_length = plVar19[1];
        *plVar19 = (long)psVar25;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pUVar20 = anon_unknown_1::UniformCollection::nestedArraysStructs
                            (DVar2,DVar13,nameWithBoolType._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
          operator_delete(nameWithBoolType._M_dataplus._M_p,
                          nameWithBoolType.field_2._M_allocated_capacity + 1);
        }
        if (local_488 != &local_478) {
          operator_delete(local_488,local_478 + 1);
        }
        if (local_460[0] != local_450) {
          operator_delete(local_460[0],local_450[0] + 1);
        }
        anon_unknown_1::UniformCollection::moveContents(pUVar20,pUVar18);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar20);
        operator_delete(pUVar20,0x30);
        lVar15 = lVar15 + 4;
        iVar12 = iVar12 + 1;
      } while (lVar15 != 0xc);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&name,(char *)0x0,pUVar18);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[8].cases,(value_type *)&name);
      if (local_498 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_498->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (*local_498->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_498->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_498 != (SharedPtrStateBase *)0x0)) {
          (*local_498->_vptr_SharedPtrStateBase[1])();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      local_438 = 0;
      do {
        pTVar21 = (TestNode *)operator_new(0x78);
        pTVar22 = local_468;
        iVar12 = (int)local_438;
        pcVar17 = (char *)0x0;
        if (iVar12 == 1) {
          pcVar17 = "by_value";
        }
        pcVar27 = (char *)0x0;
        if (iVar12 == 1) {
          pcVar27 = "Assign values by-value";
        }
        if (iVar12 == 0) {
          pcVar17 = "by_pointer";
        }
        pp_Var3 = local_468[1]._vptr_TestNode;
        if (iVar12 == 0) {
          pcVar27 = "Assign values by-pointer";
        }
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar21,(TestContext *)*pp_Var3,pcVar17,pcVar27);
        pTVar21->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
        pTVar21[1]._vptr_TestNode = pp_Var3;
        tcu::TestNode::addChild(pTVar22,pTVar21);
        local_490 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                     *)0x0;
        do {
          pTVar22 = (TestNode *)operator_new(0x78);
          iVar12 = (int)local_490;
          pcVar17 = (char *)0x0;
          if (iVar12 == 1) {
            pcVar17 = "render";
          }
          pcVar27 = (char *)0x0;
          if (iVar12 == 1) {
            pcVar27 = "Verify values by rendering";
          }
          if (iVar12 == 0) {
            pcVar17 = "get_uniform";
          }
          pCVar4 = (Context *)local_468[1]._vptr_TestNode;
          if (iVar12 == 0) {
            pcVar27 = "Verify values with glGetUniform*()";
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar22,pCVar4->m_testCtx,pcVar17,pcVar27);
          pTVar22->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
          pTVar22[1]._vptr_TestNode = (_func_int **)pCVar4;
          tcu::TestNode::addChild(pTVar21,pTVar22);
          uVar28 = 0;
          local_410 = pTVar22;
          do {
            local_418 = &defaultUniformCollections[uVar28].name;
            local_428 = 0;
            do {
              _s = (pointer)&local_3a0;
              pcVar5 = (local_418->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&s,pcVar5,pcVar5 + local_418->_M_string_length);
              std::__cxx11::string::append((char *)&s);
              pUVar31 = (((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                           *)(local_418 + 1))->
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if (0 < (int)((ulong)((long)(((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                             *)(local_418 + 1))->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pUVar31) >> 4) * -0x55555555) {
                local_404 = (uint)((int)local_428 != 0) << 8;
                lVar15 = 0;
                pTVar22 = (TestNode *)0x0;
                do {
                  name._M_dataplus._M_p = (pointer)&name.field_2;
                  lVar6 = *(long *)&pUVar31[lVar15].namePrefix._M_dataplus;
                  local_238 = lVar15;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&name,lVar6,
                             pUVar31[lVar15].namePrefix._M_string_length + lVar6);
                  bVar10 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                                     (pUVar31[lVar15].uniformCollection.m_ptr,
                                      glu::isDataTypeBoolOrBVec);
                  local_420 = (string *)&pUVar31[lVar15].uniformCollection;
                  bVar11 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                                     (((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                                        *)local_420)->m_ptr,glu::isDataTypeMatrix);
                  if ((int)local_438 == 0 || !bVar11) {
                    bVar30 = (iVar12 == 0 && uVar28 < 2) && bVar10;
                    uVar29 = 0;
                    do {
                      uVar34 = (uint)((int)uVar29 == 2) << 7;
                      if ((int)uVar29 == 1) {
                        uVar34 = 0x40;
                      }
                      local_440 = (ulong)uVar34;
                      local_230 = uVar29;
                      if ((iVar12 == 0 && uVar28 < 2) && bVar10) {
                        local_460[0] = local_450;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_460,name._M_dataplus._M_p,
                                   name._M_dataplus._M_p + name._M_string_length);
                        std::__cxx11::string::append((char *)local_460);
                        plVar19 = (long *)std::__cxx11::string::append((char *)local_460);
                        local_488 = &local_478;
                        plVar26 = plVar19 + 2;
                        if ((long *)*plVar19 == plVar26) {
                          local_478 = *plVar26;
                          lStack_470 = plVar19[3];
                        }
                        else {
                          local_478 = *plVar26;
                          local_488 = (long *)*plVar19;
                        }
                        local_480 = plVar19[1];
                        *plVar19 = (long)plVar26;
                        plVar19[1] = 0;
                        *(undefined1 *)(plVar19 + 2) = 0;
                        plVar19 = (long *)std::__cxx11::string::append((char *)&local_488);
                        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
                        psVar25 = (size_type *)(plVar19 + 2);
                        if ((size_type *)*plVar19 == psVar25) {
                          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
                          nameWithBoolType.field_2._8_8_ = plVar19[3];
                        }
                        else {
                          nameWithBoolType.field_2._M_allocated_capacity = *psVar25;
                          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar19;
                        }
                        nameWithBoolType._M_string_length = plVar19[1];
                        *plVar19 = (long)psVar25;
                        plVar19[1] = 0;
                        *(undefined1 *)(plVar19 + 2) = 0;
                      }
                      else {
                        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&nameWithBoolType,name._M_dataplus._M_p,
                                   name._M_dataplus._M_p + name._M_string_length);
                      }
                      if (bVar30) {
                        if (local_488 != &local_478) {
                          operator_delete(local_488,local_478 + 1);
                        }
                        if (local_460[0] != local_450) {
                          operator_delete(local_460[0],local_450[0] + 1);
                        }
                      }
                      local_440 = (ulong)((uint)local_440 | local_404);
                      pTVar33 = (TestNode *)0x0;
                      do {
                        nameWithMatrixType._M_dataplus._M_p = (pointer)&nameWithMatrixType.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&nameWithMatrixType,nameWithBoolType._M_dataplus._M_p,
                                   nameWithBoolType._M_dataplus._M_p +
                                   nameWithBoolType._M_string_length);
                        std::__cxx11::string::append((char *)&nameWithMatrixType);
                        iVar14 = (int)local_440;
                        uVar34 = 0;
                        local_430 = pTVar33;
                        do {
                          name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&name_1,nameWithMatrixType._M_dataplus._M_p,
                                     nameWithMatrixType._M_dataplus._M_p +
                                     nameWithMatrixType._M_string_length);
                          std::__cxx11::string::append((char *)&name_1);
                          if (pTVar22 == (TestNode *)0x0) {
                            pTVar22 = (TestNode *)operator_new(0x78);
                            pCVar4 = (Context *)local_468[1]._vptr_TestNode;
                            tcu::TestCaseGroup::TestCaseGroup
                                      ((TestCaseGroup *)pTVar22,pCVar4->m_testCtx,_s,
                                       SSBOArrayLengthTests::init::arraysSized + 1);
                            pTVar22->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
                            pTVar22[1]._vptr_TestNode = (_func_int **)pCVar4;
                            tcu::TestNode::addChild(local_410,pTVar22);
                          }
                          pUVar23 = (UniformAssignCase *)operator_new(0xf8);
                          UniformAssignCase::UniformAssignCase
                                    (pUVar23,(Context *)local_468[1]._vptr_TestNode,
                                     name_1._M_dataplus._M_p,(char *)(ulong)uVar34,
                                     (CaseShaderType)local_420,local_490,(CheckMethod)local_438,
                                     iVar14 + (uint)((int)pTVar33 == 1) * 4,
                                     in_stack_fffffffffffffb08);
                          tcu::TestNode::addChild(pTVar22,(TestNode *)pUVar23);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)name_1._M_dataplus._M_p != &name_1.field_2) {
                            operator_delete(name_1._M_dataplus._M_p,
                                            name_1.field_2._M_allocated_capacity + 1);
                          }
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != 3);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)nameWithMatrixType._M_dataplus._M_p != &nameWithMatrixType.field_2) {
                          operator_delete(nameWithMatrixType._M_dataplus._M_p,
                                          nameWithMatrixType.field_2._M_allocated_capacity + 1);
                        }
                        pTVar33 = (TestNode *)(ulong)((int)local_430 + 1);
                      } while ((uVar28 < 2 && bVar11) && (int)local_430 == 0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
                        operator_delete(nameWithBoolType._M_dataplus._M_p,
                                        nameWithBoolType.field_2._M_allocated_capacity + 1);
                      }
                      uVar29 = (ulong)((uint)local_230 + 1);
                    } while (bVar30 && (uint)local_230 < 2);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)name._M_dataplus._M_p != &name.field_2) {
                    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                  }
                  lVar15 = local_238 + 1;
                  pUVar31 = (((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                               *)(local_418 + 1))->
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                } while (lVar15 < (int)((ulong)((long)(((
                                                  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                                  *)(local_418 + 1))->
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pUVar31) >> 4) * -0x55555555);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_s != &local_3a0) {
                operator_delete(_s,local_3a0._M_allocated_capacity + 1);
              }
              iVar14 = (int)local_428;
              local_428 = (ulong)(iVar14 + 1);
            } while ((uVar28 == 1 && iVar12 == 0) && iVar14 == 0);
            uVar28 = uVar28 + 1;
          } while (uVar28 != 9);
          local_490 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                       *)(ulong)(iVar12 + 1);
        } while (iVar12 == 0);
        iVar12 = (int)local_438;
        local_438 = (ulong)(iVar12 + 1);
      } while (iVar12 == 0);
      local_440 = 0;
      do {
        assignMethod = init::arrayAssignGroups[local_440].arrayAssignMode;
        pcVar17 = init::arrayAssignGroups[local_440].name;
        pcVar27 = init::arrayAssignGroups[local_440].description;
        local_430 = (TestNode *)operator_new(0x78);
        pCVar4 = (Context *)local_468[1]._vptr_TestNode;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_430,pCVar4->m_testCtx,pcVar17,pcVar27);
        local_430->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
        local_430[1]._vptr_TestNode = (_func_int **)pCVar4;
        tcu::TestNode::addChild(local_468,local_430);
        pTVar22 = (TestNode *)0x0;
        do {
          iVar12 = init::basicArrayCollectionGroups[(long)pTVar22];
          pTVar21 = (TestNode *)operator_new(0x78);
          local_420 = &defaultUniformCollections[iVar12].name;
          pCVar4 = (Context *)local_468[1]._vptr_TestNode;
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar21,pCVar4->m_testCtx,(local_420->_M_dataplus)._M_p,
                     SSBOArrayLengthTests::init::arraysSized + 1);
          pTVar21->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
          pTVar21[1]._vptr_TestNode = (_func_int **)pCVar4;
          tcu::TestNode::addChild(local_430,pTVar21);
          pUVar31 = (((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                       *)(local_420 + 1))->
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_410 = pTVar22;
          if (0 < (int)((ulong)((long)(((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                         *)(local_420 + 1))->
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar31)
                       >> 4) * -0x55555555) {
            uVar28 = 0;
            do {
              _s = (pointer)&local_3a0;
              lVar15 = *(long *)&pUVar31[uVar28].namePrefix._M_dataplus;
              local_438 = uVar28;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&s,lVar15,pUVar31[uVar28].namePrefix._M_string_length + lVar15);
              pcVar17 = (char *)0x0;
              do {
                name._M_dataplus._M_p = (pointer)&name.field_2;
                std::__cxx11::string::_M_construct<char*>((string *)&name,_s,_s + local_3a8);
                std::__cxx11::string::append((char *)&name);
                pUVar23 = (UniformAssignCase *)operator_new(0xf8);
                UniformAssignCase::UniformAssignCase
                          (pUVar23,(Context *)local_468[1]._vptr_TestNode,name._M_dataplus._M_p,
                           pcVar17,(int)pUVar31 + (int)uVar28 * 0x30U + 0x20,
                           (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                            *)0x0,CHECKMETHOD_GET_UNIFORM,assignMethod,in_stack_fffffffffffffb08);
                tcu::TestNode::addChild(pTVar21,(TestNode *)pUVar23);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)name._M_dataplus._M_p != &name.field_2) {
                  operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                }
                uVar34 = (int)pcVar17 + 1;
                pcVar17 = (char *)(ulong)uVar34;
              } while (uVar34 != 3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_s != &local_3a0) {
                operator_delete(_s,local_3a0._M_allocated_capacity + 1);
              }
              uVar28 = local_438 + 1;
              pUVar31 = (((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                           *)(local_420 + 1))->
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            } while ((long)uVar28 <
                     (long)((int)((ulong)((long)(((
                                                  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                                  *)(local_420 + 1))->
                                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pUVar31) >> 4) * -0x55555555));
          }
          pTVar22 = (TestNode *)((long)&local_410->_vptr_TestNode + 1);
        } while (pTVar22 != (TestNode *)0x3);
        lVar15 = local_440 + 1;
        bVar10 = local_440 == 0;
        local_440 = lVar15;
      } while (bVar10);
      pTVar22 = (TestNode *)operator_new(0x78);
      pCVar4 = (Context *)local_468[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar22,pCVar4->m_testCtx,"unused_uniforms",
                 "Test with unused uniforms");
      pTVar22->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
      pTVar22[1]._vptr_TestNode = (_func_int **)pCVar4;
      tcu::TestNode::addChild(local_468,pTVar22);
      pUVar32 = (UniformCollectionGroup *)&stack0xffffffffffffffd0;
      if (0 < (int)((ulong)((long)defaultUniformCollections[4].cases.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)defaultUniformCollections[4].cases.
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
        local_490 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                     *)0x0;
        do {
          pUVar31 = defaultUniformCollections[4].cases.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          _s = (pointer)&local_3a0;
          pcVar5 = defaultUniformCollections[4].cases.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)local_490].namePrefix._M_dataplus
                   ._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&s,pcVar5,
                     pcVar5 + defaultUniformCollections[4].cases.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)local_490].namePrefix.
                              _M_string_length);
          pcVar17 = (char *)0x0;
          do {
            name._M_dataplus._M_p = (pointer)&name.field_2;
            std::__cxx11::string::_M_construct<char*>((string *)&name,_s,_s + local_3a8);
            std::__cxx11::string::append((char *)&name);
            pUVar23 = (UniformAssignCase *)operator_new(0xf8);
            UniformAssignCase::UniformAssignCase
                      (pUVar23,(Context *)local_468[1]._vptr_TestNode,name._M_dataplus._M_p,pcVar17,
                       (int)pUVar31 + (int)local_490 * 0x30 + 0x20,
                       (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                        *)0x0,CHECKMETHOD_GET_UNIFORM,0x21,in_stack_fffffffffffffb08);
            tcu::TestNode::addChild(pTVar22,(TestNode *)pUVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            uVar34 = (int)pcVar17 + 1;
            pcVar17 = (char *)(ulong)uVar34;
          } while (uVar34 != 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_s != &local_3a0) {
            operator_delete(_s,local_3a0._M_allocated_capacity + 1);
          }
          local_490 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                       *)((long)local_490 + 1);
          pUVar32 = (UniformCollectionGroup *)&stack0xffffffffffffffd0;
        } while ((long)local_490 <
                 (long)((int)((ulong)((long)defaultUniformCollections[4].cases.
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)defaultUniformCollections[4].cases.
                                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x55555555));
      }
      do {
        pUVar7 = pUVar32[-1].cases.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pUVar31 = pUVar32[-1].cases.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                       ._M_impl.super__Vector_impl_data._M_start; pUVar31 != pUVar7;
            pUVar31 = pUVar31 + 1) {
          pSVar8 = (pUVar31->uniformCollection).m_state;
          if (pSVar8 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSVar8->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              (pUVar31->uniformCollection).m_ptr = (UniformCollection *)0x0;
              (*((pUVar31->uniformCollection).m_state)->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &((pUVar31->uniformCollection).m_state)->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              pSVar8 = (pUVar31->uniformCollection).m_state;
              if (pSVar8 != (SharedPtrStateBase *)0x0) {
                (*pSVar8->_vptr_SharedPtrStateBase[1])();
              }
              (pUVar31->uniformCollection).m_state = (SharedPtrStateBase *)0x0;
            }
          }
          pcVar5 = (pUVar31->namePrefix)._M_dataplus._M_p;
          paVar24 = &(pUVar31->namePrefix).field_2;
          if (paVar24 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5) {
            operator_delete(pcVar5,paVar24->_M_allocated_capacity + 1);
          }
        }
        pUVar31 = pUVar32[-1].cases.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pUVar31 != (pointer)0x0) {
          operator_delete(pUVar31,(long)pUVar32[-1].cases.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pUVar31);
        }
        pcVar5 = pUVar32[-1].name._M_dataplus._M_p;
        paVar24 = &pUVar32[-1].name.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != paVar24) {
          operator_delete(pcVar5,paVar24->_M_allocated_capacity + 1);
        }
        pUVar32 = pUVar32 + -1;
      } while (pUVar32 != defaultUniformCollections);
      return (int)defaultUniformCollections;
    }
  } while( true );
}

Assistant:

void ProgramUniformTests::init (void)
{
	// Generate sets of UniformCollections that are used by several cases.

	enum
	{
		UNIFORMCOLLECTIONS_BASIC = 0,
		UNIFORMCOLLECTIONS_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_BASIC_STRUCT,
		UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY,
		UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT,
		UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS,

		UNIFORMCOLLECTIONS_LAST
	};

	struct UniformCollectionGroup
	{
		string							name;
		vector<UniformCollectionCase>	cases;
	} defaultUniformCollections[UNIFORMCOLLECTIONS_LAST];

	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].name							= "basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].name						= "basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].name						= "basic_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].name					= "struct_in_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].name					= "array_in_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].name			= "nested_structs_arrays";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].name					= "multiple_basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].name				= "multiple_basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].name	= "multiple_nested_structs_arrays";

	for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_testDataTypes); dataTypeNdx++)
	{
		const glu::DataType		dataType	= s_testDataTypes[dataTypeNdx];
		const char* const		typeName	= glu::getDataTypeName(dataType);

		defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basic(dataType)));

		if (glu::isDataTypeScalar(dataType)													||
			(glu::isDataTypeVector(dataType) && glu::getDataTypeScalarSize(dataType) == 4)	||
			dataType == glu::TYPE_FLOAT_MAT4												||
			dataType == glu::TYPE_SAMPLER_2D)
			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basicArray(dataType)));

		if (glu::isDataTypeScalar(dataType)		||
			dataType == glu::TYPE_FLOAT_MAT4	||
			dataType == glu::TYPE_SAMPLER_2D)
		{
			const glu::DataType		secondDataType	= glu::isDataTypeScalar(dataType)	? glu::getDataTypeVector(dataType, 4)
													: dataType == glu::TYPE_FLOAT_MAT4	? glu::TYPE_FLOAT_MAT2
													: dataType == glu::TYPE_SAMPLER_2D	? glu::TYPE_SAMPLER_CUBE
													: glu::TYPE_LAST;
			DE_ASSERT(secondDataType != glu::TYPE_LAST);
			const char* const		secondTypeName	= glu::getDataTypeName(secondDataType);
			const string			name			= string("") + typeName + "_" + secondTypeName;

			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].cases.push_back			(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, true)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::structInArray(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(name.c_str(), UniformCollection::nestedArraysStructs(dataType, secondDataType)));
		}
	}
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].cases.push_back					(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasic()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].cases.push_back				(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasicArray()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(DE_NULL, UniformCollection::multipleNestedArraysStructs()));

	// Basic by-pointer or by-value uniform assignment cases.

	for (int assignMethodI = 0; assignMethodI < (int)UniformAssignCase::ASSIGNMETHOD_LAST; assignMethodI++)
	{
		const UniformAssignCase::AssignMethod	assignMethod		= (UniformAssignCase::AssignMethod)assignMethodI;
		TestCaseGroup* const					assignMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getAssignMethodName(assignMethod), UniformAssignCase::getAssignMethodDescription(assignMethod));
		addChild(assignMethodGroup);

		for (int checkMethodI = 0; checkMethodI < (int)UniformAssignCase::CHECKMETHOD_LAST; checkMethodI++)
		{
			const UniformAssignCase::CheckMethod	checkMethod			= (UniformAssignCase::CheckMethod)checkMethodI;
			TestCaseGroup* const					checkMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getCheckMethodName(checkMethod), UniformAssignCase::getCheckMethodDescription(checkMethod));
			assignMethodGroup->addChild(checkMethodGroup);

			for (int collectionGroupNdx = 0; collectionGroupNdx < (int)UNIFORMCOLLECTIONS_LAST; collectionGroupNdx++)
			{
				const int numArrayFirstElemNameCases = checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY ? 2 : 1;

				for (int referToFirstArrayElemWithoutIndexI = 0; referToFirstArrayElemWithoutIndexI < numArrayFirstElemNameCases; referToFirstArrayElemWithoutIndexI++)
				{
					const UniformCollectionGroup&	collectionGroup			= defaultUniformCollections[collectionGroupNdx];
					const string					collectionGroupName		= collectionGroup.name + (referToFirstArrayElemWithoutIndexI == 0 ? "" : "_first_elem_without_brackets");
					TestCaseGroup*					collectionTestGroup		= DE_NULL;

					for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
					{
						const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
						const string								collName			= collectionCase.namePrefix;
						const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;
						const bool									containsBooleans	= uniformCollection->containsMatchingBasicType(glu::isDataTypeBoolOrBVec);
						const bool									varyBoolApiType		= checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && containsBooleans &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numBoolVariations	= varyBoolApiType ? 3 : 1;
						const bool									containsMatrices	= uniformCollection->containsMatchingBasicType(glu::isDataTypeMatrix);
						const bool									varyMatrixMode		= containsMatrices &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numMatVariations	= varyMatrixMode ? 2 : 1;

						if (containsMatrices && assignMethod != UniformAssignCase::ASSIGNMETHOD_POINTER)
							continue;

						for (int booleanTypeI = 0; booleanTypeI < numBoolVariations; booleanTypeI++)
						{
							const deUint32		booleanTypeFeat		= booleanTypeI == 1 ? UniformCase::FEATURE_BOOLEANAPITYPE_INT
																	: booleanTypeI == 2 ? UniformCase::FEATURE_BOOLEANAPITYPE_UINT
																	: 0;
							const char* const	booleanTypeName		= booleanTypeI == 1 ? "int"
																	: booleanTypeI == 2 ? "uint"
																	: "float";
							const string		nameWithBoolType	= varyBoolApiType ? collName + "api_" + booleanTypeName + "_" : collName;

							for (int matrixTypeI = 0; matrixTypeI < numMatVariations; matrixTypeI++)
							{
								const string nameWithMatrixType = nameWithBoolType + (matrixTypeI == 1 ? "row_major_" : "");

								for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
								{
									const string	name							= nameWithMatrixType + getCaseShaderTypeName((CaseShaderType)shaderType);
									const deUint32	arrayFirstElemNameNoIndexFeat	= referToFirstArrayElemWithoutIndexI == 0 ? 0 : UniformCase::FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX;

									// skip empty groups by creating groups on demand
									if (!collectionTestGroup)
									{
										collectionTestGroup = new TestCaseGroup(m_context, collectionGroupName.c_str(), "");
										checkMethodGroup->addChild(collectionTestGroup);
									}

									collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																						checkMethod, assignMethod,
																						booleanTypeFeat | arrayFirstElemNameNoIndexFeat | (matrixTypeI == 1 ? UniformCase::FEATURE_MATRIXMODE_ROWMAJOR : 0)));
								}
							}
						}
					}
				}
			}
		}
	}

	// Cases that assign multiple basic-array elements with one glProgramUniform*v() (i.e. the count parameter is bigger than 1).

	{
		static const struct
		{
			UniformCase::Feature	arrayAssignMode;
			const char*				name;
			const char*				description;
		} arrayAssignGroups[] =
		{
			{ UniformCase::FEATURE_ARRAYASSIGN_FULL,			"basic_array_assign_full",		"Assign entire basic-type arrays per glProgramUniform*v() call"				},
			{ UniformCase::FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO,	"basic_array_assign_partial",	"Assign two elements of a basic-type array per glProgramUniform*v() call"	}
		};

		for (int arrayAssignGroupNdx = 0; arrayAssignGroupNdx < DE_LENGTH_OF_ARRAY(arrayAssignGroups); arrayAssignGroupNdx++)
		{
			UniformCase::Feature	arrayAssignMode		= arrayAssignGroups[arrayAssignGroupNdx].arrayAssignMode;
			const char* const		groupName			= arrayAssignGroups[arrayAssignGroupNdx].name;
			const char* const		groupDesc			= arrayAssignGroups[arrayAssignGroupNdx].description;

			TestCaseGroup* const curArrayAssignGroup = new TestCaseGroup(m_context, groupName, groupDesc);
			addChild(curArrayAssignGroup);

			static const int basicArrayCollectionGroups[] = { UNIFORMCOLLECTIONS_BASIC_ARRAY, UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT, UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY };

			for (int collectionGroupNdx = 0; collectionGroupNdx < DE_LENGTH_OF_ARRAY(basicArrayCollectionGroups); collectionGroupNdx++)
			{
				const UniformCollectionGroup&	collectionGroup		= defaultUniformCollections[basicArrayCollectionGroups[collectionGroupNdx]];
				TestCaseGroup* const			collectionTestGroup	= new TestCaseGroup(m_context, collectionGroup.name.c_str(), "");
				curArrayAssignGroup->addChild(collectionTestGroup);

				for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
				{
					const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
					const string								collName			= collectionCase.namePrefix;
					const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

					for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
					{
						const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
						collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																			UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																			arrayAssignMode));
					}
				}
			}
		}
	}

	// Cases with unused uniforms.

	{
		TestCaseGroup* const unusedUniformsGroup = new TestCaseGroup(m_context, "unused_uniforms", "Test with unused uniforms");
		addChild(unusedUniformsGroup);

		const UniformCollectionGroup& collectionGroup = defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT];

		for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
		{
			const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
			const string								collName			= collectionCase.namePrefix;
			const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

			for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
			{
				const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
				unusedUniformsGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																	UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																	UniformCase::FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX | UniformCase::FEATURE_UNIFORMUSAGE_EVERY_OTHER));
			}
		}
	}
}